

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_list.cpp
# Opt level: O1

void __thiscall rk_list::rk_list(rk_list *this,node_destructor func)

{
  rk_list_node *prVar1;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_1c;
  
  this->destroy = (node_destructor)0x0;
  this->head = (rk_list_node *)0x0;
  this->count = 0;
  pthread_mutexattr_init(&local_1c);
  pthread_mutexattr_settype(&local_1c,1);
  pthread_mutex_init((pthread_mutex_t *)this,&local_1c);
  pthread_mutexattr_destroy(&local_1c);
  this->destroy = func;
  prVar1 = (rk_list_node *)malloc(0x18);
  this->head = prVar1;
  if (prVar1 == (rk_list_node *)0x0) {
    _mpp_log_l(2,0,"failed to allocate list header",0);
  }
  else {
    prVar1->next = prVar1;
    prVar1->prev = prVar1;
    prVar1->key = 0;
    prVar1->size = 0;
  }
  return;
}

Assistant:

rk_list::rk_list(node_destructor func)
    : destroy(NULL),
      head(NULL),
      count(0)
{
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&mutex, &attr);
    pthread_mutexattr_destroy(&attr);
    destroy = func;
    head = (rk_list_node*)malloc(sizeof(rk_list_node));
    if (NULL == head) {
        LIST_ERROR("failed to allocate list header");
    } else {
        list_node_init_with_key_and_size(head, 0, 0);
    }
}